

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lazy.h
# Opt level: O2

Try<int> * __thiscall
async_simple::coro::detail::LazyPromise<std::pair<std::error_code,_unsigned_long>_>::tryResult
          (Try<int> *__return_storage_ptr__,
          LazyPromise<std::pair<std::error_code,_unsigned_long>_> *this)

{
  error_category *peVar1;
  variant_alternative_t<1UL,_variant<monostate,_pair<error_code,_unsigned_long>,_exception_ptr>_>
  *pvVar2;
  variant_alternative_t<2UL,_variant<monostate,_pair<error_code,_unsigned_long>,_exception_ptr>_>
  *__other;
  exception_ptr eStack_18;
  
  if (this->field_0x30 == '\x02') {
    __other = std::
              get<2ul,std::monostate,std::pair<std::error_code,unsigned_long>,std::__exception_ptr::exception_ptr>
                        (&this->_value);
    std::__exception_ptr::exception_ptr::exception_ptr(&eStack_18,__other);
    std::
    variant<std::monostate,std::pair<std::error_code,unsigned_long>,std::__exception_ptr::exception_ptr>
    ::
    variant<std::__exception_ptr::exception_ptr&,void,void,std::__exception_ptr::exception_ptr,void>
              ((variant<std::monostate,std::pair<std::error_code,unsigned_long>,std::__exception_ptr::exception_ptr>
                *)__return_storage_ptr__,&eStack_18);
    std::__exception_ptr::exception_ptr::~exception_ptr(&eStack_18);
  }
  else {
    pvVar2 = std::
             get<1ul,std::monostate,std::pair<std::error_code,unsigned_long>,std::__exception_ptr::exception_ptr>
                       (&this->_value);
    *(unsigned_long *)
     &__return_storage_ptr__[1]._value.
      super__Variant_base<std::monostate,_int,_std::__exception_ptr::exception_ptr>.
      super__Move_assign_alias<std::monostate,_int,_std::__exception_ptr::exception_ptr>.
      super__Copy_assign_alias<std::monostate,_int,_std::__exception_ptr::exception_ptr>.
      super__Move_ctor_alias<std::monostate,_int,_std::__exception_ptr::exception_ptr>.
      super__Copy_ctor_alias<std::monostate,_int,_std::__exception_ptr::exception_ptr>.
      super__Variant_storage_alias<std::monostate,_int,_std::__exception_ptr::exception_ptr> =
         pvVar2->second;
    peVar1 = (pvVar2->first)._M_cat;
    (__return_storage_ptr__->_value).
    super__Variant_base<std::monostate,_int,_std::__exception_ptr::exception_ptr>.
    super__Move_assign_alias<std::monostate,_int,_std::__exception_ptr::exception_ptr>.
    super__Copy_assign_alias<std::monostate,_int,_std::__exception_ptr::exception_ptr>.
    super__Move_ctor_alias<std::monostate,_int,_std::__exception_ptr::exception_ptr>.
    super__Copy_ctor_alias<std::monostate,_int,_std::__exception_ptr::exception_ptr>.
    super__Variant_storage_alias<std::monostate,_int,_std::__exception_ptr::exception_ptr>._M_u =
         *(undefined8 *)&pvVar2->first;
    *(error_category **)
     ((long)&(__return_storage_ptr__->_value).
             super__Variant_base<std::monostate,_int,_std::__exception_ptr::exception_ptr>.
             super__Move_assign_alias<std::monostate,_int,_std::__exception_ptr::exception_ptr>.
             super__Copy_assign_alias<std::monostate,_int,_std::__exception_ptr::exception_ptr>.
             super__Move_ctor_alias<std::monostate,_int,_std::__exception_ptr::exception_ptr>.
             super__Copy_ctor_alias<std::monostate,_int,_std::__exception_ptr::exception_ptr>.
             super__Variant_storage_alias<std::monostate,_int,_std::__exception_ptr::exception_ptr>
     + 8) = peVar1;
    *(__index_type *)
     ((long)&__return_storage_ptr__[1]._value.
             super__Variant_base<std::monostate,_int,_std::__exception_ptr::exception_ptr>.
             super__Move_assign_alias<std::monostate,_int,_std::__exception_ptr::exception_ptr>.
             super__Copy_assign_alias<std::monostate,_int,_std::__exception_ptr::exception_ptr>.
             super__Move_ctor_alias<std::monostate,_int,_std::__exception_ptr::exception_ptr>.
             super__Copy_ctor_alias<std::monostate,_int,_std::__exception_ptr::exception_ptr>.
             super__Variant_storage_alias<std::monostate,_int,_std::__exception_ptr::exception_ptr>
     + 8) = '\x01';
  }
  return __return_storage_ptr__;
}

Assistant:

Try<T> tryResult() noexcept {
        if (std::holds_alternative<std::exception_ptr>(_value))
            AS_UNLIKELY { return Try<T>(std::get<std::exception_ptr>(_value)); }